

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

void __thiscall PlayerA::SetSampleRate(PlayerA *this,UINT32 sampleRate)

{
  uint uVar1;
  size_type sVar2;
  reference ppPVar3;
  ulong local_20;
  size_t curPlr;
  UINT32 sampleRate_local;
  PlayerA *this_local;
  
  this->_smplRate = sampleRate;
  for (local_20 = 0;
      sVar2 = std::vector<PlayerBase_*,_std::allocator<PlayerBase_*>_>::size(&this->_avbPlrs),
      local_20 < sVar2; local_20 = local_20 + 1) {
    ppPVar3 = std::vector<PlayerBase_*,_std::allocator<PlayerBase_*>_>::operator[]
                        (&this->_avbPlrs,local_20);
    if ((*ppPVar3 != this->_player) ||
       (uVar1 = (*this->_player->_vptr_PlayerBase[0x19])(), (uVar1 & 1) == 0)) {
      ppPVar3 = std::vector<PlayerBase_*,_std::allocator<PlayerBase_*>_>::operator[]
                          (&this->_avbPlrs,local_20);
      (*(*ppPVar3)->_vptr_PlayerBase[0xf])(*ppPVar3,(ulong)this->_smplRate);
    }
  }
  return;
}

Assistant:

void PlayerA::SetSampleRate(UINT32 sampleRate)
{
	_smplRate = sampleRate;
	for (size_t curPlr = 0; curPlr < _avbPlrs.size(); curPlr++)
	{
		if (_avbPlrs[curPlr] == _player && (_player->GetState() & PLAYSTATE_PLAY))
			continue;
		_avbPlrs[curPlr]->SetSampleRate(_smplRate);
	}
	return;
}